

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O0

void __thiscall ast::Section::read_block(Section *this,uint offset,uint8_t *buffer,uint size)

{
  ulong __n;
  size_t fill_size;
  size_t fill_offset;
  uint size_local;
  uint8_t *buffer_local;
  uint offset_local;
  Section *this_local;
  
  if (offset < this->content_capacity) {
    if (this->content_capacity < offset + size) {
      __n = (ulong)(this->content_capacity - offset);
      memset(buffer + __n,0x55,size - __n);
      memcpy(buffer,this->content + offset,__n);
    }
    else {
      memcpy(buffer,this->content + offset,(ulong)size);
    }
  }
  else {
    memset(buffer,0x55,(ulong)size);
  }
  return;
}

Assistant:

void Section::read_block(unsigned offset, uint8_t *buffer, unsigned size)
{
	if (offset >= content_capacity)
		memset(buffer, 0x55, size);
	else if (offset + size > content_capacity) {
		size_t fill_offset = content_capacity - offset;
		size_t fill_size = size - fill_offset;
		memset(buffer + fill_offset, 0x55, fill_size);
		memcpy(buffer, content + offset, fill_offset);
	}
	else
		memcpy(buffer, content + offset, size);
}